

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

FFont * FFont::FindFont(char *name)

{
  int iVar1;
  FFont *local_20;
  FFont *font;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    local_20 = FirstFont;
    while ((local_20 != (FFont *)0x0 && (iVar1 = strcasecmp(local_20->Name,name), iVar1 != 0))) {
      local_20 = local_20->Next;
    }
    name_local = (char *)local_20;
  }
  return (FFont *)name_local;
}

Assistant:

FFont *FFont::FindFont (const char *name)
{
	if (name == NULL)
	{
		return NULL;
	}
	FFont *font = FirstFont;

	while (font != NULL)
	{
		if (stricmp (font->Name, name) == 0)
			break;
		font = font->Next;
	}
	return font;
}